

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O0

int logmath_free(logmath_t *lmath)

{
  int iVar1;
  logmath_t *lmath_local;
  
  if (lmath == (logmath_t *)0x0) {
    lmath_local._4_4_ = 0;
  }
  else {
    iVar1 = lmath->refcount + -1;
    lmath->refcount = iVar1;
    if (iVar1 < 1) {
      if (lmath->filemap == (mmio_file_t *)0x0) {
        ckd_free((lmath->t).table);
      }
      else {
        mmio_file_unmap(lmath->filemap);
      }
      ckd_free(lmath);
      lmath_local._4_4_ = 0;
    }
    else {
      lmath_local._4_4_ = lmath->refcount;
    }
  }
  return lmath_local._4_4_;
}

Assistant:

int
logmath_free(logmath_t *lmath)
{
    if (lmath == NULL)
        return 0;
    if (--lmath->refcount > 0)
        return lmath->refcount;
    if (lmath->filemap)
        mmio_file_unmap(lmath->filemap);
    else
        ckd_free(lmath->t.table);
    ckd_free(lmath);
    return 0;
}